

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Services.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cali::services::get_available_services_abi_cxx11_(void)

{
  ServicesManager *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  
  this = anon_unknown.dwarf_2c8235::ServicesManager::instance();
  (anonymous_namespace)::ServicesManager::get_available_services_abi_cxx11_(in_RDI,this);
  return in_RDI;
}

Assistant:

std::vector<std::string> get_available_services()
{
    return ServicesManager::instance()->get_available_services();
}